

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O1

VmConstant * LoadFrameLong(InstructionVMEvalContext *ctx,Storage *storage,uint offset,VmType type)

{
  ulong value;
  bool bVar1;
  VmConstant *pVVar2;
  
  bVar1 = InstructionVMEvalContext::Storage::Reserve(storage,ctx,offset,8);
  if (!bVar1) {
    anon_unknown.dwarf_255680::Report(ctx,"ERROR: out of stack space");
    return (VmConstant *)0x0;
  }
  value = *(ulong *)((storage->data).data + offset);
  if (type.type == VM_TYPE_POINTER) {
    if (value >> 0x20 == 0) {
      pVVar2 = CreateConstantPointer
                         (ctx->allocator,(SynBase *)0x0,(int)value,(VariableData *)0x0,
                          type.structType,false);
      return pVVar2;
    }
    __assert_fail("unsigned(value) == value",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                  ,0xdd,
                  "VmConstant *LoadFrameLong(InstructionVMEvalContext &, InstructionVMEvalContext::Storage *, unsigned int, VmType)"
                 );
  }
  pVVar2 = CreateConstantLong(ctx->allocator,(SynBase *)0x0,value);
  return pVVar2;
}

Assistant:

VmConstant* LoadFrameLong(InstructionVMEvalContext &ctx, InstructionVMEvalContext::Storage *storage, unsigned offset, VmType type)
{
	long long value = 0;
	if(!storage->Reserve(ctx, offset, sizeof(value)))
		return (VmConstant*)Report(ctx, "ERROR: out of stack space");

	memcpy(&value, storage->data.data + offset, sizeof(value));

	if(type.type == VM_TYPE_POINTER)
	{
		assert(unsigned(value) == value);

		return CreateConstantPointer(ctx.allocator, NULL, unsigned(value), NULL, type.structType, false);
	}

	return CreateConstantLong(ctx.allocator, NULL, value);
}